

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *p,Gia_Obj_t *pObj,int f,Vec_Int_t *vSelect,int Sign)

{
  Rfn_Obj_t RVar1;
  Gia_Man_t *pGVar2;
  Vec_Int_t *p_00;
  int iVar3;
  int iVar4;
  Rfn_Obj_t *pRVar5;
  Gia_Obj_t *pObj_00;
  ulong uVar6;
  Rfn_Obj_t *pRVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  while( true ) {
    pRVar5 = Gla_ObjRef(p,pObj,f);
    RVar1 = *pRVar5;
    if (((uint)RVar1 >> 0x13 & 0xfff) != Sign) {
      return;
    }
    if (((uint)RVar1 & 2) != 0) {
      __assert_fail("pRef->fVisit == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                    ,0x126,
                    "void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                   );
    }
    *pRVar5 = (Rfn_Obj_t)((uint)RVar1 | 2);
    if (((uint)RVar1 & 4) != 0) {
      if (((uint)RVar1 & 0x7fff8) == 0) {
        __assert_fail("(int)pRef->Prio > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,0x12a,
                      "void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                     );
      }
      for (iVar3 = p->pPars->iFrame; -1 < iVar3; iVar3 = iVar3 + -1) {
        pRVar5 = Gla_ObjRef(p,pObj,iVar3);
        if (((uint)*pRVar5 & 2) == 0) {
          Gia_ManRefSetAndPropFanout_rec(p,pObj,iVar3,vSelect,Sign);
        }
      }
      iVar3 = Gia_ObjId(p->pGia,pObj);
      Vec_IntPush(vSelect,iVar3);
      return;
    }
    if (((~*(uint *)pObj & 0x1fffffff) != 0 && (int)*(uint *)pObj < 0) && (f == p->pPars->iFrame)) {
      return;
    }
    iVar3 = Gia_ObjIsPo(p->pGia,pObj);
    if (iVar3 != 0) {
      return;
    }
    iVar3 = Gia_ObjIsRi(p->pGia,pObj);
    if (iVar3 == 0) break;
    pObj = Gia_ObjRiToRo(p->pGia,pObj);
    f = f + 1;
    pRVar5 = Gla_ObjRef(p,pObj,f);
    if (((uint)*pRVar5 & 2) != 0) {
      return;
    }
  }
  iVar3 = Gia_ObjIsRo(p->pGia,pObj);
  if ((iVar3 == 0) &&
     (((int)(uint)*(undefined8 *)pObj < 0 ||
      (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)))) {
    __assert_fail("Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                  ,0x13a,
                  "void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                 );
  }
  iVar3 = 0;
  do {
    pGVar2 = p->pGia;
    iVar4 = Gia_ObjId(pGVar2,pObj);
    iVar4 = Vec_IntEntry(pGVar2->vFanoutNums,iVar4);
    if (iVar4 <= iVar3) {
      return;
    }
    pGVar2 = p->pGia;
    iVar4 = Gia_ObjId(pGVar2,pObj);
    p_00 = pGVar2->vFanout;
    iVar4 = Vec_IntEntry(p_00,iVar4);
    iVar4 = Vec_IntEntry(p_00,iVar4 + iVar3);
    pObj_00 = Gia_ManObj(pGVar2,iVar4);
    pRVar5 = Gla_ObjRef(p,pObj_00,f);
    if (((uint)*pRVar5 & 2) == 0) {
      iVar4 = (int)*(ulong *)pObj_00;
      uVar6 = *(ulong *)pObj_00 & 0x1fffffff;
      if (-1 < iVar4 || uVar6 == 0x1fffffff) {
        if ((iVar4 < 0) || ((int)uVar6 == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pFanout)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                        ,0x145,
                        "void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                       );
        }
        pRVar5 = Gla_ObjRef(p,pObj_00 + -uVar6,f);
        pRVar7 = Gla_ObjRef(p,pObj_00 + -(ulong)(*(uint *)&pObj_00->field_0x4 & 0x1fffffff),f);
        uVar9 = ((uint)(*(ulong *)pObj_00 >> 0x1d) & 7 ^ (uint)*pRVar5) & 1;
        uVar10 = (uint)*pRVar5 & 2;
        if ((uVar10 == 0) || (uVar9 != 0)) {
          RVar1 = *pRVar7;
          uVar8 = (uint)(*(ulong *)pObj_00 >> 0x3d) ^ (uint)RVar1;
          if (((((uint)RVar1 & 2) == 0) || ((uVar8 & 1) != 0)) &&
             (((uVar10 & (uint)RVar1) == 0 || ((uVar9 & uVar8) == 0)))) goto LAB_004a0073;
        }
      }
      Gia_ManRefSetAndPropFanout_rec(p,pObj_00,f,vSelect,Sign);
    }
LAB_004a0073:
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void Gia_ManRefSetAndPropFanout_rec( Gla_Man_t * p, Gia_Obj_t * pObj, int f, Vec_Int_t * vSelect, int Sign )
{
    int i;//, Id = Gia_ObjId(p->pGia, pObj);
    Rfn_Obj_t * pRef0, * pRef1, * pRef = Gla_ObjRef( p, pObj, f );
    Gia_Obj_t * pFanout;
    int k;
    if ( (int)pRef->Sign != Sign )
        return;
    assert( pRef->fVisit == 0 );
    pRef->fVisit = 1;
    if ( pRef->fPPi )
    {
        assert( (int)pRef->Prio > 0 );
        for ( i = p->pPars->iFrame; i >= 0; i-- )
            if ( !Gla_ObjRef(p, pObj, i)->fVisit )
                Gia_ManRefSetAndPropFanout_rec( p, pObj, i, vSelect, Sign );
        Vec_IntPush( vSelect, Gia_ObjId(p->pGia, pObj) );
        return;
    }
    if ( (Gia_ObjIsCo(pObj) && f == p->pPars->iFrame) || Gia_ObjIsPo(p->pGia, pObj) )
        return;
    if ( Gia_ObjIsRi(p->pGia, pObj) )
    {
        pFanout = Gia_ObjRiToRo(p->pGia, pObj);
        if ( !Gla_ObjRef(p, pFanout, f+1)->fVisit )
            Gia_ManRefSetAndPropFanout_rec( p, pFanout, f+1, vSelect, Sign );
        return;
    }
    assert( Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) );
    Gia_ObjForEachFanoutStatic( p->pGia, pObj, pFanout, k )
    {
//        Rfn_Obj_t * pRefF = Gla_ObjRef(p, pFanout, f);
        if ( Gla_ObjRef(p, pFanout, f)->fVisit )
            continue;
        if ( Gia_ObjIsCo(pFanout) )
        {
            Gia_ManRefSetAndPropFanout_rec( p, pFanout, f, vSelect, Sign );
            continue;
        } 
        assert( Gia_ObjIsAnd(pFanout) );
        pRef0 = Gla_ObjRef( p, Gia_ObjFanin0(pFanout), f );
        pRef1 = Gla_ObjRef( p, Gia_ObjFanin1(pFanout), f );
        if ( ((pRef0->Value ^ Gia_ObjFaninC0(pFanout)) == 0 && pRef0->fVisit) ||
             ((pRef1->Value ^ Gia_ObjFaninC1(pFanout)) == 0 && pRef1->fVisit) || 
           ( ((pRef0->Value ^ Gia_ObjFaninC0(pFanout)) == 1 && pRef0->fVisit) && 
             ((pRef1->Value ^ Gia_ObjFaninC1(pFanout)) == 1 && pRef1->fVisit) ) )
           Gia_ManRefSetAndPropFanout_rec( p, pFanout, f, vSelect, Sign );
    }
}